

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<BasicTestExpr<2>_(bool)>::UntypedPerformAction
          (FunctionMockerBase<BasicTestExpr<2>_(bool)> *this,void *untyped_action,void *untyped_args
          )

{
  ActionResultHolder<BasicTestExpr<2>_> *pAVar1;
  Action<BasicTestExpr<2>_(bool)> *in_RDX;
  ArgumentTuple *args;
  Action<BasicTestExpr<2>_(bool)> action;
  Action<BasicTestExpr<2>_(bool)> *in_stack_ffffffffffffffa8;
  ArgumentTuple *in_stack_ffffffffffffffc8;
  Action<BasicTestExpr<2>_(bool)> local_28;
  Action<BasicTestExpr<2>_(bool)> *local_18;
  
  local_18 = in_RDX;
  Action<BasicTestExpr<2>_(bool)>::Action(&local_28,in_stack_ffffffffffffffa8);
  pAVar1 = ActionResultHolder<BasicTestExpr<2>>::PerformAction<BasicTestExpr<2>(bool)>
                     (local_18,in_stack_ffffffffffffffc8);
  Action<BasicTestExpr<2>_(bool)>::~Action((Action<BasicTestExpr<2>_(bool)> *)0x2c2e31);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }